

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

void __thiscall Namespace<true>::AddFeature(Namespace<true> *this,vw *all,char *str)

{
  features *this_00;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  char *in_RDX;
  long in_RDI;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__p;
  feature_index in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  feature_value v;
  string *s;
  vw *in_stack_ffffffffffffffa0;
  char **in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined1 local_39 [57];
  
  v = (feature_value)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  s = (string *)local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_39 + 1),in_RDX,(allocator *)s);
  this_00 = (features *)VW::hash_feature(in_stack_ffffffffffffffa0,s,(uint64_t)in_RDX);
  features::push_back(this_00,v,in_stack_ffffffffffffff60);
  std::__cxx11::string::~string((string *)(local_39 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_39);
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
  this_01 = (v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(*(long *)(in_RDI + 0x10) + 0x40);
  operator_new(0x40);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*&,_const_char_*&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (char **)in_stack_ffffffffffffffa0);
  __p = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xffffffffffffffa0;
  std::shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>>::
  shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
            ((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_01,__p);
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back(this_01,(shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)__p);
  std::
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~shared_ptr((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x263f47);
  return;
}

Assistant:

void AddFeature(vw* all, const char* str)
  {
    ftrs->push_back(1., VW::hash_feature(*all, str, namespace_hash));
    feature_count++;

    if (audit)
      ftrs->space_names.push_back(audit_strings_ptr(new audit_strings(name, str)));
  }